

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask26_32(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  undefined1 auVar2 [16];
  long unaff_RBX;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  
  uVar1 = in[9];
  auVar12._4_4_ = uVar1;
  auVar12._0_4_ = uVar1;
  auVar12._8_4_ = uVar1;
  auVar12._12_4_ = uVar1;
  uVar1 = in[4];
  auVar15._4_4_ = uVar1;
  auVar15._0_4_ = uVar1;
  auVar15._8_4_ = uVar1;
  auVar15._12_4_ = uVar1;
  auVar2 = *(undefined1 (*) [16])(in + 6);
  auVar6 = vpmovsxbd_avx512f(_DAT_00184390);
  auVar3 = vpbroadcastd_avx512vl();
  auVar14 = vpblendd_avx2(auVar15,auVar12,0xc);
  auVar13._8_8_ = 0x1600000018;
  auVar13._0_8_ = 0x1600000018;
  auVar12 = vpinsrd_avx(*(undefined1 (*) [16])(in + 1),in[5] << 2,3);
  auVar16._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar12;
  auVar16._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  auVar7 = vpmovsxbd_avx512f(_DAT_00184370);
  auVar5 = vpblendd_avx2(auVar16,auVar3,0x80);
  auVar12 = vpshufd_avx(auVar13,0x50);
  auVar12 = vpsrlvd_avx2(auVar14,auVar12);
  auVar3 = vpmovsxbd_avx2(ZEXT816(0x100a0400120c06));
  auVar4 = vpermq_avx2(ZEXT1632(auVar12),0x60);
  auVar5 = vpor_avx2(auVar5,auVar4);
  auVar4 = vpsrlvd_avx2(auVar16,auVar3);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(in + 0x11);
  auVar12 = vpsrlvd_avx2(auVar17,auVar3._0_16_);
  auVar3 = vpblendd_avx2(auVar4,auVar5,0x88);
  auVar14 = vpsrlvd_avx2(*(undefined1 (*) [16])(in + 0xb),_DAT_0018ffb0);
  auVar8 = vinserti32x4_avx512f
                     (ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                          ZEXT116(1) * auVar2,
                                          ZEXT116(0) * auVar2 +
                                          ZEXT116(1) * *(undefined1 (*) [16])(in + 1))),
                      *(undefined1 (*) [16])(in + 0xb),2);
  auVar9 = vpbroadcastd_avx512f(ZEXT416(in[0xf]));
  auVar10._0_48_ = auVar8._0_48_;
  auVar10._48_4_ = auVar9._48_4_;
  auVar10._52_4_ = auVar8._52_4_;
  auVar10._56_4_ = auVar8._56_4_;
  auVar10._60_4_ = auVar8._60_4_;
  auVar6 = vpermi2d_avx512f(auVar6,ZEXT3264(auVar3),ZEXT464(*in));
  auVar8 = vpmovsxbd_avx512f(_DAT_001843a0);
  auVar9 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
  auVar7 = vpermi2d_avx512f(auVar7,auVar10,ZEXT864(*(ulong *)(in + 0x11)));
  auVar10 = vpbroadcastd_avx512f(ZEXT416(in[0x13]));
  auVar6 = vpermi2d_avx512f(auVar8,auVar6,ZEXT1664(auVar14));
  auVar8 = vmovdqa32_avx512f(auVar10);
  auVar8._0_60_ = auVar7._0_60_;
  auVar7 = vpsllvd_avx512f(auVar8,_DAT_001a0c40);
  auVar8 = vpbroadcastd_avx512f(ZEXT416(in[0x10]));
  auVar11._0_52_ = auVar6._0_52_;
  auVar11._52_4_ = auVar8._52_4_;
  auVar11._56_4_ = auVar6._56_4_;
  auVar11._60_4_ = auVar6._60_4_;
  auVar6 = vpermi2q_avx512f(auVar9,auVar11,ZEXT1664(auVar12));
  vpmovsxbd_avx2(ZEXT816(0x74706c64605c5850));
  auVar6 = vpord_avx512f(auVar7,auVar6);
  auVar6 = vmovdqu64_avx512f(auVar6);
  *(undefined1 (*) [64])out = auVar6;
  auVar4 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + unaff_RBX));
  auVar2 = vpinsrd_avx(ZEXT416(in[0x15]),in[0x1a],1);
  auVar12 = vpsllvd_avx2(auVar2,_DAT_00192cd0);
  auVar2 = vpunpckldq_avx(auVar4._0_16_,auVar4._16_16_);
  auVar2 = vpsrlvd_avx2(auVar2,auVar13);
  auVar3 = vpmovsxbd_avx2(ZEXT816(0x706090403020800));
  auVar2 = vpor_avx(auVar12,auVar2);
  auVar5 = valignd_avx512vl(auVar4,auVar4,7);
  auVar5 = vpblendd_avx2(auVar5,auVar10._0_32_,1);
  auVar5 = vpsrlvd_avx2(auVar5,_DAT_0019dda0);
  auVar5 = vpermi2d_avx512vl(auVar3,auVar5,ZEXT1632(auVar2));
  auVar3 = vpsllvd_avx2(auVar4,_DAT_0019dde0);
  auVar3 = vpor_avx2(auVar3,auVar5);
  *(undefined1 (*) [32])(out + 0x10) = auVar3;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(in + 0x1e);
  auVar2 = vpalignr_avx(auVar14,auVar4._16_16_,0xc);
  auVar12 = vpsrlvd_avx2(auVar2,_DAT_00192790);
  auVar2 = vpsllvd_avx2(auVar14,_DAT_001927a0);
  auVar2 = vpor_avx(auVar2,auVar12);
  *(long *)(out + 0x18) = auVar2._0_8_;
  return out + 0x1a;
}

Assistant:

uint32_t *__fastpackwithoutmask26_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (26 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (26 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (26 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (26 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (26 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (26 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (26 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++out;
  *out = ((*in)) >> (26 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (26 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (26 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (26 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (26 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (26 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (26 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (26 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (26 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (26 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (26 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (26 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++out;
  *out = ((*in)) >> (26 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (26 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (26 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (26 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (26 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++out;
  ++in;

  return out;
}